

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alu.cpp
# Opt level: O1

ResamplerFunc PrepareResampler(Resampler resampler,ALuint increment,InterpState *state)

{
  uint uVar1;
  BSincTable *pBVar2;
  code *pcVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  pcVar3 = Resample_<PointTag,CTag>;
  switch(resampler - Linear) {
  case Point:
    goto switchD_00136b1a_caseD_0;
  case Linear:
    goto switchD_00136b1a_caseD_1;
  case Cubic:
  case FastBSinc12:
    if (increment < 0x1001) {
      fVar5 = 0.0;
      uVar4 = 0xf;
    }
    else {
      fVar6 = (4096.0 / (float)increment - 0.16479042) * 15.0 * 1.1973042;
      fVar5 = 0.0;
      if (0.0 <= fVar6) {
        fVar5 = fVar6;
      }
      uVar4 = (ulong)(uint)(int)fVar5;
      fVar5 = asinf(fVar5 - (float)uVar4);
      fVar5 = cosf(fVar5);
      fVar5 = 1.0 - fVar5;
    }
    (state->bsinc).sf = fVar5;
    pBVar2 = &bsinc12;
    break;
  case BSinc12:
  case FastBSinc24:
    if (increment < 0x1001) {
      fVar5 = 0.0;
      uVar4 = 0xf;
    }
    else {
      fVar6 = (4096.0 / (float)increment - 0.078812815) * 15.0 * 1.0855557;
      fVar5 = 0.0;
      if (0.0 <= fVar6) {
        fVar5 = fVar6;
      }
      uVar4 = (ulong)(uint)(int)fVar5;
      fVar5 = asinf(fVar5 - (float)uVar4);
      fVar5 = cosf(fVar5);
      fVar5 = 1.0 - fVar5;
    }
    (state->bsinc).sf = fVar5;
    pBVar2 = &bsinc24;
    break;
  default:
    goto switchD_00136b1a_default;
  }
  uVar1 = pBVar2->m[uVar4];
  (state->bsinc).m = uVar1;
  (state->bsinc).l = (uVar1 >> 1) - 1;
  (state->bsinc).filter = pBVar2->Tab + pBVar2->filterOffset[uVar4];
  switch(resampler - Linear) {
  case Point:
switchD_00136b1a_caseD_0:
    if ((CPUCapFlags & 8U) == 0) {
      if ((CPUCapFlags & 2U) == 0) {
        pcVar3 = Resample_<LerpTag,CTag>;
      }
      else {
        pcVar3 = Resample_<LerpTag,SSE2Tag>;
      }
    }
    else {
      pcVar3 = Resample_<LerpTag,SSE4Tag>;
    }
    break;
  case Linear:
switchD_00136b1a_caseD_1:
    pcVar3 = Resample_<CubicTag,CTag>;
    break;
  case FastBSinc12:
  case FastBSinc24:
    if (0x1000 < increment) {
      if ((CPUCapFlags & 1U) == 0) {
        return Resample_<BSincTag,CTag>;
      }
      return Resample_<BSincTag,SSETag>;
    }
  case Cubic:
  case BSinc12:
    if ((CPUCapFlags & 1U) == 0) {
      pcVar3 = Resample_<FastBSincTag,CTag>;
    }
    else {
      pcVar3 = Resample_<FastBSincTag,SSETag>;
    }
  }
switchD_00136b1a_default:
  return pcVar3;
}

Assistant:

ResamplerFunc PrepareResampler(Resampler resampler, ALuint increment, InterpState *state)
{
    switch(resampler)
    {
    case Resampler::Point:
    case Resampler::Linear:
    case Resampler::Cubic:
        break;
    case Resampler::FastBSinc12:
    case Resampler::BSinc12:
        BsincPrepare(increment, &state->bsinc, &bsinc12);
        break;
    case Resampler::FastBSinc24:
    case Resampler::BSinc24:
        BsincPrepare(increment, &state->bsinc, &bsinc24);
        break;
    }
    return SelectResampler(resampler, increment);
}